

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O3

int Timidity::read_config_file(char *name,bool ismain)

{
  int *piVar1;
  ToneBankElement *pTVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int keynote;
  uint uVar6;
  FileReader *pFVar7;
  undefined4 extraout_var;
  char *pcVar8;
  undefined8 *puVar9;
  char *pcVar10;
  undefined4 extraout_var_00;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int lumpnum;
  FCommandLine w;
  char tmp [1024];
  int local_494;
  ToneBank *local_490;
  int local_46c;
  char *local_468;
  FCommandLine local_460;
  char local_438 [1032];
  
  if (read_config_file::rcf_count < 0x33) {
    if (ismain) {
      pathExpander._16_4_ = 0;
      pFVar7 = PathExpander::openFileReader((PathExpander *)pathExpander,name,&local_46c);
      if (pFVar7 != (FileReader *)0x0) {
        if (local_46c < 1) {
          pathExpander._16_4_ = 2;
        }
        else {
          pathExpander._16_4_ = 1;
          PathExpander::clearPathlist((PathExpander *)pathExpander);
        }
LAB_003579ef:
        iVar3 = (*(pFVar7->super_FileReaderBase)._vptr_FileReaderBase[5])(pFVar7,local_438,0x400);
        if (CONCAT44(extraout_var,iVar3) != 0) {
          uVar14 = 0;
          local_468 = "%s: line %d: syntax error\n";
          local_490 = (ToneBank *)0x0;
          do {
            FCommandLine::FCommandLine(&local_460,local_438,true);
            uVar4 = FCommandLine::argc(&local_460);
            uVar14 = uVar14 + 1;
            iVar3 = read_config_file::rcf_count;
            if (uVar4 != 0) {
              pcVar8 = FCommandLine::operator[](&local_460,0);
              iVar3 = strcmp(pcVar8,"#extension");
              if (iVar3 == 0) {
                FCommandLine::Shift(&local_460);
                uVar4 = uVar4 - 1;
              }
              else {
                pcVar8 = FCommandLine::operator[](&local_460,0);
                iVar3 = read_config_file::rcf_count;
                if (*pcVar8 == '#') goto LAB_003584f8;
              }
              uVar12 = uVar4;
              if (0 < (int)uVar4) {
                uVar11 = 0;
                do {
                  pcVar8 = FCommandLine::operator[](&local_460,uVar11);
                  uVar12 = uVar11;
                  if (*pcVar8 == '#') break;
                  uVar11 = uVar11 + 1;
                  uVar12 = uVar4;
                } while (uVar4 != uVar11);
              }
              pcVar8 = FCommandLine::operator[](&local_460,0);
              iVar5 = strcmp(pcVar8,"comm");
              iVar3 = read_config_file::rcf_count;
              if (iVar5 != 0) {
                pcVar8 = FCommandLine::operator[](&local_460,0);
                iVar5 = strcmp(pcVar8,"HTTPproxy");
                iVar3 = read_config_file::rcf_count;
                if (iVar5 != 0) {
                  pcVar8 = FCommandLine::operator[](&local_460,0);
                  iVar5 = strcmp(pcVar8,"FTPproxy");
                  iVar3 = read_config_file::rcf_count;
                  if (iVar5 != 0) {
                    pcVar8 = FCommandLine::operator[](&local_460,0);
                    iVar5 = strcmp(pcVar8,"mailaddr");
                    iVar3 = read_config_file::rcf_count;
                    if (iVar5 != 0) {
                      pcVar8 = FCommandLine::operator[](&local_460,0);
                      iVar5 = strcmp(pcVar8,"opt");
                      iVar3 = read_config_file::rcf_count;
                      if (iVar5 != 0) {
                        pcVar8 = FCommandLine::operator[](&local_460,0);
                        iVar5 = strcmp(pcVar8,"timeout");
                        iVar3 = read_config_file::rcf_count;
                        if (iVar5 != 0) {
                          pcVar8 = FCommandLine::operator[](&local_460,0);
                          iVar5 = strcmp(pcVar8,"copydrumset");
                          iVar3 = read_config_file::rcf_count;
                          if (iVar5 != 0) {
                            pcVar8 = FCommandLine::operator[](&local_460,0);
                            iVar5 = strcmp(pcVar8,"copybank");
                            iVar3 = read_config_file::rcf_count;
                            if (iVar5 != 0) {
                              pcVar8 = FCommandLine::operator[](&local_460,0);
                              iVar5 = strcmp(pcVar8,"undef");
                              iVar3 = read_config_file::rcf_count;
                              if (iVar5 != 0) {
                                pcVar8 = FCommandLine::operator[](&local_460,0);
                                iVar5 = strcmp(pcVar8,"altassign");
                                iVar3 = read_config_file::rcf_count;
                                if (iVar5 != 0) {
                                  pcVar8 = FCommandLine::operator[](&local_460,0);
                                  iVar3 = strcmp(pcVar8,"soundfont");
                                  if (iVar3 == 0) {
                                    if ((int)uVar12 < 2) {
                                      pcVar8 = "%s: line %d: No soundfont given\n";
                                      goto LAB_00358566;
                                    }
                                    if (uVar12 != 2) {
                                      pcVar8 = FCommandLine::operator[](&local_460,2);
                                      iVar3 = strcmp(pcVar8,"remove");
                                      if (iVar3 == 0) {
                                        pcVar8 = FCommandLine::operator[](&local_460,1);
                                        font_remove(pcVar8);
                                        iVar3 = read_config_file::rcf_count;
                                        goto LAB_003584f8;
                                      }
                                      uVar4 = 2;
                                      do {
                                        pcVar8 = FCommandLine::operator[](&local_460,uVar4);
                                        pcVar8 = strchr(pcVar8,0x3d);
                                        if (pcVar8 == (char *)0x0) {
                                          pcVar8 = FCommandLine::operator[](&local_460,uVar4);
                                          Printf("%s: line %d: bad soundfont option %s\n",name,
                                                 (ulong)uVar14,pcVar8);
                                          goto LAB_00358597;
                                        }
                                        uVar4 = uVar4 + 1;
                                      } while (uVar12 != uVar4);
                                    }
                                    pcVar8 = FCommandLine::operator[](&local_460,1);
                                    font_add(pcVar8,0);
                                    iVar3 = read_config_file::rcf_count;
                                  }
                                  else {
                                    pcVar8 = FCommandLine::operator[](&local_460,0);
                                    iVar3 = strcmp(pcVar8,"font");
                                    if (iVar3 == 0) {
                                      if ((int)uVar12 < 3) {
LAB_00358583:
                                        Printf(local_468,name,(ulong)uVar14);
LAB_00358597:
                                        (*(pFVar7->super_FileReaderBase)._vptr_FileReaderBase[1])
                                                  (pFVar7);
LAB_003585a0:
                                        FCommandLine::~FCommandLine(&local_460);
                                        return -2;
                                      }
                                      pcVar8 = FCommandLine::operator[](&local_460,1);
                                      iVar3 = strcmp(pcVar8,"exclude");
                                      if (iVar3 == 0) {
                                        iVar3 = 0xfe;
                                        uVar4 = 2;
                                      }
                                      else {
                                        pcVar8 = FCommandLine::operator[](&local_460,1);
                                        iVar3 = strcmp(pcVar8,"order");
                                        if (iVar3 != 0) {
                                          local_468 = 
                                          "%s: line %d: font subcommand must be \'order\' or \'exclude\'\n"
                                          ;
                                          goto LAB_00358583;
                                        }
                                        pcVar8 = FCommandLine::operator[](&local_460,2);
                                        iVar3 = atoi(pcVar8);
                                        uVar4 = 3;
                                      }
                                      iVar5 = -1;
                                      uVar11 = 3;
                                      local_494 = -1;
                                      if (uVar4 < uVar12) {
                                        pcVar8 = FCommandLine::operator[](&local_460,uVar4);
                                        uVar11 = uVar4 + 1;
                                        local_494 = atoi(pcVar8);
                                      }
                                      if (uVar11 < uVar12) {
                                        pcVar8 = FCommandLine::operator[](&local_460,uVar11);
                                        uVar11 = uVar11 + 1;
                                        iVar5 = atoi(pcVar8);
                                      }
                                      keynote = -1;
                                      if (uVar11 < uVar12) {
                                        pcVar8 = FCommandLine::operator[](&local_460,uVar11);
                                        keynote = atoi(pcVar8);
                                      }
                                      if (local_494 != 0x80) {
                                        keynote = iVar5;
                                        iVar5 = local_494;
                                      }
                                      font_order(iVar3,(uint)(local_494 == 0x80),iVar5,keynote);
                                      iVar3 = read_config_file::rcf_count;
                                    }
                                    else {
                                      pcVar8 = FCommandLine::operator[](&local_460,0);
                                      iVar5 = strcmp(pcVar8,"progbase");
                                      iVar3 = read_config_file::rcf_count;
                                      if (iVar5 != 0) {
                                        pcVar8 = FCommandLine::operator[](&local_460,0);
                                        iVar5 = strcmp(pcVar8,"map");
                                        iVar3 = read_config_file::rcf_count;
                                        if (iVar5 != 0) {
                                          pcVar8 = FCommandLine::operator[](&local_460,0);
                                          iVar3 = strcmp(pcVar8,"dir");
                                          if (iVar3 == 0) {
                                            if ((int)uVar12 < 2) {
                                              pcVar8 = "%s: line %d: No directory given\n";
                                              goto LAB_00358566;
                                            }
                                            uVar4 = 1;
                                            do {
                                              pcVar8 = FCommandLine::operator[](&local_460,uVar4);
                                              PathExpander::addToPathlist
                                                        ((PathExpander *)pathExpander,pcVar8);
                                              uVar4 = uVar4 + 1;
                                              iVar3 = read_config_file::rcf_count;
                                            } while (uVar12 != uVar4);
                                          }
                                          else {
                                            pcVar8 = FCommandLine::operator[](&local_460,0);
                                            iVar3 = strcmp(pcVar8,"source");
                                            if (iVar3 != 0) {
                                              pcVar8 = FCommandLine::operator[](&local_460,0);
                                              iVar3 = strcmp(pcVar8,"default");
                                              if (iVar3 == 0) {
                                                if (uVar12 == 2) {
                                                  pcVar8 = FCommandLine::operator[](&local_460,1);
                                                  FString::operator=((FString *)&def_instr_name,
                                                                     pcVar8);
                                                  iVar3 = read_config_file::rcf_count;
                                                  goto LAB_003584f8;
                                                }
                                                pcVar8 = 
                                                "%s: line %d: Must specify exactly one patch name\n"
                                                ;
                                              }
                                              else {
                                                pcVar8 = FCommandLine::operator[](&local_460,0);
                                                iVar3 = strcmp(pcVar8,"drumset");
                                                if (iVar3 == 0) {
                                                  if ((int)uVar12 < 2) {
                                                    pcVar8 = 
                                                  "%s: line %d: No drum set number given\n";
                                                  }
                                                  else {
                                                    pcVar8 = FCommandLine::operator[](&local_460,1);
                                                    uVar4 = atoi(pcVar8);
                                                    if (uVar4 < 0x80) {
                                                      uVar13 = (ulong)uVar4;
                                                      local_490 = (ToneBank *)(&drumset)[uVar13];
                                                      iVar3 = read_config_file::rcf_count;
                                                      if (local_490 == (ToneBank *)0x0) {
                                                        local_490 = (ToneBank *)operator_new(0x408);
                                                        ToneBank::ToneBank(local_490);
                                                        puVar9 = &drumset;
LAB_0035812b:
                                                        puVar9[uVar13] = local_490;
                                                        iVar3 = read_config_file::rcf_count;
                                                      }
                                                      goto LAB_003584f8;
                                                    }
                                                    pcVar8 = 
                                                  "%s: line %d: Drum set must be between 0 and 127\n"
                                                  ;
                                                  }
                                                }
                                                else {
                                                  pcVar8 = FCommandLine::operator[](&local_460,0);
                                                  iVar3 = strcmp(pcVar8,"bank");
                                                  if (iVar3 == 0) {
                                                    if ((int)uVar12 < 2) {
                                                      pcVar8 = "%s: line %d: No bank number given\n"
                                                      ;
                                                    }
                                                    else {
                                                      pcVar8 = FCommandLine::operator[]
                                                                         (&local_460,1);
                                                      uVar4 = atoi(pcVar8);
                                                      if (uVar4 < 0x80) {
                                                        uVar13 = (ulong)uVar4;
                                                        local_490 = (ToneBank *)(&tonebank)[uVar13];
                                                        iVar3 = read_config_file::rcf_count;
                                                        if (local_490 == (ToneBank *)0x0) {
                                                          local_490 = (ToneBank *)
                                                                      operator_new(0x408);
                                                          ToneBank::ToneBank(local_490);
                                                          puVar9 = &tonebank;
                                                          goto LAB_0035812b;
                                                        }
                                                        goto LAB_003584f8;
                                                      }
                                                      pcVar8 = 
                                                  "%s: line %d: Tone bank must be between 0 and 127\n"
                                                  ;
                                                  }
                                                  }
                                                  else if ((((int)uVar12 < 2) ||
                                                           (pcVar8 = FCommandLine::operator[]
                                                                               (&local_460,0),
                                                           *pcVar8 < '0')) ||
                                                          (pcVar8 = FCommandLine::operator[]
                                                                              (&local_460,0),
                                                          '9' < *pcVar8)) {
                                                    pcVar8 = "%s: line %d: syntax error\n";
                                                  }
                                                  else {
                                                    pcVar8 = FCommandLine::operator[](&local_460,0);
                                                    uVar4 = atoi(pcVar8);
                                                    if (uVar4 < 0x80) {
                                                      if (local_490 != (ToneBank *)0x0) {
                                                        pTVar2 = local_490->tone;
                                                        piVar1 = &pTVar2[uVar4].note;
                                                        *piVar1 = -1;
                                                        piVar1[1] = -1;
                                                        piVar1[2] = -1;
                                                        piVar1[3] = -1;
                                                        *(undefined8 *)
                                                         ((long)&pTVar2[uVar4].fontpreset + 3) =
                                                             0xffffffffffffffff;
                                                        pcVar8 = FCommandLine::operator[]
                                                                           (&local_460,1);
                                                        iVar3 = strcmp(pcVar8,"%font");
                                                        if (iVar3 == 0) {
                                                          pcVar8 = FCommandLine::operator[]
                                                                             (&local_460,2);
                                                          FString::operator=(&local_490->tone[uVar4]
                                                                              .name,pcVar8);
                                                          pcVar8 = FCommandLine::operator[]
                                                                             (&local_460,3);
                                                          iVar3 = atoi(pcVar8);
                                                          local_490->tone[uVar4].fontbank = iVar3;
                                                          pcVar8 = FCommandLine::operator[]
                                                                             (&local_460,4);
                                                          iVar3 = atoi(pcVar8);
                                                          pTVar2 = local_490->tone;
                                                          pTVar2[uVar4].fontpreset = iVar3;
                                                          uVar11 = 5;
                                                          if ((5 < uVar12) &&
                                                             ((pTVar2[uVar4].fontbank == 0x80 ||
                                                              ((pcVar8 = FCommandLine::operator[]
                                                                                   (&local_460,5),
                                                               '/' < *pcVar8 &&
                                                               (pcVar8 = FCommandLine::operator[]
                                                                                   (&local_460,5),
                                                               *pcVar8 < ':')))))) {
                                                            pcVar8 = FCommandLine::operator[]
                                                                               (&local_460,5);
                                                            iVar3 = atoi(pcVar8);
                                                            local_490->tone[uVar4].fontnote = iVar3;
                                                            uVar11 = 6;
                                                          }
                                                          pcVar8 = FCommandLine::operator[]
                                                                             (&local_460,2);
                                                          font_add(pcVar8,0xfe);
                                                        }
                                                        else {
                                                          pcVar8 = FCommandLine::operator[]
                                                                             (&local_460,1);
                                                          uVar11 = 2;
                                                          FString::operator=(&local_490->tone[uVar4]
                                                                              .name,pcVar8);
                                                        }
                                                        iVar3 = read_config_file::rcf_count;
                                                        if (uVar11 < uVar12) {
                                                          do {
                                                            pcVar8 = FCommandLine::operator[]
                                                                               (&local_460,uVar11);
                                                            pcVar8 = strchr(pcVar8,0x3d);
                                                            if (pcVar8 == (char *)0x0) {
LAB_003585b4:
                                                              pcVar8 = FCommandLine::operator[]
                                                                                 (&local_460,uVar11)
                                                              ;
                                                              Printf(
                                                  "%s: line %d: bad patch option %s\n",name,
                                                  (ulong)uVar14,pcVar8);
                                                  goto LAB_00358597;
                                                  }
                                                  *pcVar8 = '\0';
                                                  pcVar10 = FCommandLine::operator[]
                                                                      (&local_460,uVar11);
                                                  iVar3 = strcmp(pcVar10,"amp");
                                                  if (iVar3 != 0) {
                                                    pcVar10 = FCommandLine::operator[]
                                                                        (&local_460,uVar11);
                                                    pcVar8 = pcVar8 + 1;
                                                    iVar3 = strcmp(pcVar10,"note");
                                                    if (iVar3 == 0) {
                                                      uVar6 = atoi(pcVar8);
                                                      if ((0x7f < uVar6) ||
                                                         ((byte)(*pcVar8 - 0x3aU) < 0xf6)) {
                                                        pcVar8 = 
                                                  "%s: line %d: note must be between 0 and 127\n";
                                                  goto LAB_00358566;
                                                  }
                                                  local_490->tone[uVar4].note = uVar6;
                                                  }
                                                  else {
                                                    pcVar10 = FCommandLine::operator[]
                                                                        (&local_460,uVar11);
                                                    iVar3 = strcmp(pcVar10,"pan");
                                                    if (iVar3 == 0) {
                                                      iVar3 = strcmp(pcVar8,"center");
                                                      if (iVar3 == 0) {
                                                        uVar6 = 0x40;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar8,"left");
                                                        if (iVar3 == 0) {
LAB_00358430:
                                                          uVar6 = 0;
                                                          if (*pcVar8 != '-' &&
                                                              (byte)(*pcVar8 - 0x3aU) < 0xf6) {
LAB_0035866a:
                                                            pcVar8 = 
                                                  "%s: line %d: panning must be left, right, center, or between -100 and 100\n"
                                                  ;
                                                  goto LAB_00358566;
                                                  }
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar8,"right");
                                                    if (iVar3 == 0) {
                                                      uVar6 = 0x7f;
                                                    }
                                                    else {
                                                      iVar3 = atoi(pcVar8);
                                                      uVar6 = (iVar3 * 100 + 10000) / 0x9d;
                                                      if (0x7f < uVar6) goto LAB_0035866a;
                                                      if (iVar3 * 100 + 0x27acU < 0x139)
                                                      goto LAB_00358430;
                                                    }
                                                  }
                                                  }
                                                  local_490->tone[uVar4].pan = uVar6;
                                                  }
                                                  else {
                                                    pcVar10 = FCommandLine::operator[]
                                                                        (&local_460,uVar11);
                                                    iVar3 = strcmp(pcVar10,"keep");
                                                    if (iVar3 == 0) {
                                                      iVar3 = strcmp(pcVar8,"env");
                                                      if (iVar3 == 0) {
                                                        local_490->tone[uVar4].strip_envelope = '\0'
                                                        ;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar8,"loop");
                                                        if (iVar3 != 0) {
                                                          pcVar8 = 
                                                  "%s: line %d: keep must be env or loop\n";
                                                  goto LAB_00358566;
                                                  }
                                                  local_490->tone[uVar4].strip_loop = '\0';
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = FCommandLine::operator[]
                                                                        (&local_460,uVar11);
                                                    iVar3 = strcmp(pcVar10,"strip");
                                                    if (iVar3 != 0) goto LAB_003585b4;
                                                    iVar3 = strcmp(pcVar8,"env");
                                                    if (iVar3 == 0) {
                                                      local_490->tone[uVar4].strip_envelope = '\x01'
                                                      ;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar8,"loop");
                                                      if (iVar3 == 0) {
                                                        local_490->tone[uVar4].strip_loop = '\x01';
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar8,"tail");
                                                        if (iVar3 != 0) {
                                                          pcVar8 = 
                                                  "%s: line %d: strip must be env, loop, or tail\n";
                                                  goto LAB_00358566;
                                                  }
                                                  local_490->tone[uVar4].strip_tail = '\x01';
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  uVar11 = uVar11 + 1;
                                                  iVar3 = read_config_file::rcf_count;
                                                  } while (uVar12 != uVar11);
                                                  }
                                                  goto LAB_003584f8;
                                                  }
                                                  pcVar8 = 
                                                  "%s: line %d: Must specify tone bank or drum set before assignment\n"
                                                  ;
                                                  }
                                                  else {
                                                    pcVar8 = 
                                                  "%s: line %d: Program must be between 0 and 127\n"
                                                  ;
                                                  }
                                                  }
                                                }
                                              }
LAB_00358566:
                                              Printf(pcVar8,name,(ulong)uVar14);
                                              goto LAB_00358597;
                                            }
                                            if ((int)uVar12 < 2) {
                                              Printf("%s: line %d: No file name given\n",name,
                                                     (ulong)uVar14);
                                              goto LAB_003585a0;
                                            }
                                            read_config_file::rcf_count =
                                                 read_config_file::rcf_count + 1;
                                            uVar4 = 1;
                                            do {
                                              pcVar8 = FCommandLine::operator[](&local_460,uVar4);
                                              read_config_file(pcVar8,false);
                                              uVar4 = uVar4 + 1;
                                              iVar3 = read_config_file::rcf_count + -1;
                                            } while (uVar12 != uVar4);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
LAB_003584f8:
            read_config_file::rcf_count = iVar3;
            FCommandLine::~FCommandLine(&local_460);
            iVar3 = (*(pFVar7->super_FileReaderBase)._vptr_FileReaderBase[5])
                              (pFVar7,local_438,0x400);
          } while (CONCAT44(extraout_var_00,iVar3) != 0);
        }
        (*(pFVar7->super_FileReaderBase)._vptr_FileReaderBase[1])(pFVar7);
        return 0;
      }
    }
    else {
      pFVar7 = PathExpander::openFileReader((PathExpander *)pathExpander,name,&local_46c);
      if (pFVar7 != (FileReader *)0x0) goto LAB_003579ef;
    }
  }
  else {
    Printf("Timidity: Probable source loop in configuration files\n");
  }
  return -1;
}

Assistant:

static int read_config_file(const char *name, bool ismain)
{
	FileReader *fp;
	char tmp[1024], *cp;
	ToneBank *bank = NULL;
	int i, j, k, line = 0, words;
	static int rcf_count = 0;
	int lumpnum;

	if (rcf_count > 50)
	{
		Printf("Timidity: Probable source loop in configuration files\n");
		return (-1);
	}

	if (ismain) pathExpander.openmode = PathExpander::OM_FILEORLUMP;

	if (!(fp = pathExpander.openFileReader(name, &lumpnum)))
		return -1;

	if (ismain)
	{
		if (lumpnum > 0)
		{
			pathExpander.openmode = PathExpander::OM_LUMP;
			pathExpander.clearPathlist();	// when reading from a PK3 we don't want to use any external path
		}
		else
		{
			pathExpander.openmode = PathExpander::OM_FILE;
		}
	}

	while (fp->Gets(tmp, sizeof(tmp)))
	{
		line++;
		FCommandLine w(tmp, true);
		words = w.argc();
		if (words == 0) continue;

		/* Originally the TiMidity++ extensions were prefixed like this */
		if (strcmp(w[0], "#extension") == 0)
		{
			w.Shift();
			words--;
		}
		else if (*w[0] == '#')
		{
			continue;
		}

		for (i = 0; i < words; ++i)
		{
			if (*w[i] == '#')
			{
				words = i;
				break;
			}
		}

		/*
		 * TiMidity++ adds a number of extensions to the config file format.
		 * Many of them are completely irrelevant to SDL_sound, but at least
		 * we shouldn't choke on them.
		 *
		 * Unfortunately the documentation for these extensions is often quite
		 * vague, gramatically strange or completely absent.
		 */
		if (
			!strcmp(w[0], "comm")			/* "comm" program second        */
			|| !strcmp(w[0], "HTTPproxy")	/* "HTTPproxy" hostname:port    */
			|| !strcmp(w[0], "FTPproxy")	/* "FTPproxy" hostname:port     */
			|| !strcmp(w[0], "mailaddr")	/* "mailaddr" your-mail-address */
			|| !strcmp(w[0], "opt")			/* "opt" timidity-options       */
			)
		{
			/*
			* + "comm" sets some kind of comment -- the documentation is too
			*   vague for me to understand at this time.
			* + "HTTPproxy", "FTPproxy" and "mailaddr" are for reading data
			*   over a network, rather than from the file system.
			* + "opt" specifies default options for TiMidity++.
			*
			* These are all quite useless for our version of TiMidity, so
			* they can safely remain no-ops.
			*/
		}
		else if (!strcmp(w[0], "timeout"))	/* "timeout" program second */
		{
			/*
			* Specifies a timeout value of the program. A number of seconds
			* before TiMidity kills the note. This may be useful to implement
			* later, but I don't see any urgent need for it.
			*/
			//Printf("FIXME: Implement \"timeout\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "copydrumset")	/* "copydrumset" drumset */
			|| !strcmp(w[0], "copybank"))		/* "copybank" bank       */
		{
			/*
			* Copies all the settings of the specified drumset or bank to
			* the current drumset or bank. May be useful later, but not a
			* high priority.
			*/
			//Printf("FIXME: Implement \"%s\" in TiMidity config.\n", w[0]);
		}
		else if (!strcmp(w[0], "undef"))		/* "undef" progno */
		{
			/*
			* Undefines the tone "progno" of the current tone bank (or
			* drum set?). Not a high priority.
			*/
			//Printf("FIXME: Implement \"undef\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "altassign")) /* "altassign" prog1 prog2 ... */
		{
			/*
			* Sets the alternate assign for drum set. Whatever that's
			* supposed to mean.
			*/
			//Printf("FIXME: Implement \"altassign\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "soundfont"))
		{
			/*
			* "soundfont" sf_file "remove"
			* "soundfont" sf_file ["order=" order] ["cutoff=" cutoff]
			*                     ["reso=" reso] ["amp=" amp]
			*/
			if (words < 2)
			{
				Printf("%s: line %d: No soundfont given\n", name, line);
				delete fp;
				return -2;
			}
			if (words > 2 && !strcmp(w[2], "remove"))
			{
				font_remove(w[1]);
			}
			else
			{
				int order = 0;

				for (i = 2; i < words; ++i)
				{
					if (!(cp = strchr(w[i], '=')))
					{
						Printf("%s: line %d: bad soundfont option %s\n", name, line, w[i]);
						delete fp;
						return -2;
					}
				}
				font_add(w[1], order);
			}
		}
		else if (!strcmp(w[0], "font"))
		{
			/*
			* "font" "exclude" bank preset keynote
			* "font" "order" order bank preset keynote
			*/
			int order, drum = -1, bank = -1, instr = -1;

			if (words < 3)
			{
				Printf("%s: line %d: syntax error\n", name, line);
				delete fp;
				return -2;
			}

			if (!strcmp(w[1], "exclude"))
			{
				order = 254;
				i = 2;
			}
			else if (!strcmp(w[1], "order"))
			{
				order = atoi(w[2]);
				i = 3;
			}
			else
			{
				Printf("%s: line %d: font subcommand must be 'order' or 'exclude'\n", name, line);
				delete fp;
				return -2;
			}
			if (i < words)
			{
				drum = atoi(w[i++]);
			}
			if (i < words)
			{
				bank = atoi(w[i++]);
			}
			if (i < words)
			{
				instr = atoi(w[i++]);
			}
			if (drum != 128)
			{
				instr = bank;
				bank = drum;
				drum = 0;
			}
			else
			{
				drum = 1;
			}
			font_order(order, drum, bank, instr);
		}
		else if (!strcmp(w[0], "progbase"))
		{
			/*
			* The documentation for this makes absolutely no sense to me, but
			* apparently it sets some sort of base offset for tone numbers.
			* Why anyone would want to do this is beyond me.
			*/
			//Printf("FIXME: Implement \"progbase\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "map")) /* "map" name set1 elem1 set2 elem2 */
		{
			/*
			* This extension is the one we will need to implement, as it is
			* used by the "eawpats". Unfortunately I cannot find any
			* documentation whatsoever for it, but it looks like it's used
			* for remapping one instrument to another somehow.
			*/
			//Printf("FIXME: Implement \"map\" in TiMidity config.\n");
		}

		/* Standard TiMidity config */

		else if (!strcmp(w[0], "dir"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No directory given\n", name, line);
				delete fp;
				return -2;
			}
			for (i = 1; i < words; i++)
				pathExpander.addToPathlist(w[i]);
		}
		else if (!strcmp(w[0], "source"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No file name given\n", name, line);
				return -2;
			}
			for (i=1; i<words; i++)
			{
				rcf_count++;
				read_config_file(w[i], false);
				rcf_count--;
			}
		}
		else if (!strcmp(w[0], "default"))
		{
			if (words != 2)
			{
				Printf("%s: line %d: Must specify exactly one patch name\n", name, line);
				delete fp;
				return -2;
			}
			def_instr_name = w[1];
		}
		else if (!strcmp(w[0], "drumset"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No drum set number given\n", name, line);
				delete fp;
				return -2;
			}
			i = atoi(w[1]);
			if (i < 0 || i > 127)
			{
				Printf("%s: line %d: Drum set must be between 0 and 127\n", name, line);
				delete fp;
				return -2;
			}
			if (drumset[i] == NULL)
			{
				drumset[i] = new ToneBank;
			}
			bank = drumset[i];
		}
		else if (!strcmp(w[0], "bank"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No bank number given\n", name, line);
				delete fp;
				return -2;
			}
			i = atoi(w[1]);
			if (i < 0 || i > 127)
			{
				Printf("%s: line %d: Tone bank must be between 0 and 127\n", name, line);
				delete fp;
				return -2;
			}
			if (tonebank[i] == NULL)
			{
				tonebank[i] = new ToneBank;
			}
			bank = tonebank[i];
		}
		else
		{
			if ((words < 2) || (*w[0] < '0' || *w[0] > '9'))
			{
				Printf("%s: line %d: syntax error\n", name, line);
				delete fp;
				return -2;
			}
			i = atoi(w[0]);
			if (i < 0 || i > 127)
			{
				Printf("%s: line %d: Program must be between 0 and 127\n", name, line);
				delete fp;
				return -2;
			}
			if (bank == NULL)
			{
				Printf("%s: line %d: Must specify tone bank or drum set before assignment\n", name, line);
				delete fp;
				return -2;
			}
			bank->tone[i].note = bank->tone[i].pan =
				bank->tone[i].fontbank = bank->tone[i].fontpreset =
				bank->tone[i].fontnote = bank->tone[i].strip_loop = 
				bank->tone[i].strip_envelope = bank->tone[i].strip_tail = -1;

			if (!strcmp(w[1], "%font"))
			{
				bank->tone[i].name = w[2];
				bank->tone[i].fontbank = atoi(w[3]);
				bank->tone[i].fontpreset = atoi(w[4]);
				if (words > 5 && (bank->tone[i].fontbank == 128 || (w[5][0] >= '0' && w[5][0] <= '9')))
				{
					bank->tone[i].fontnote = atoi(w[5]);
					j = 6;
				}
				else
				{
					j = 5;
				}
				font_add(w[2], 254);
			}
			else
			{
				bank->tone[i].name = w[1];
				j = 2;
			}

			for (; j<words; j++)
			{
				if (!(cp=strchr(w[j], '=')))
				{
					Printf("%s: line %d: bad patch option %s\n", name, line, w[j]);
					delete fp;
					return -2;
				}
				*cp++ = 0;
				if (!strcmp(w[j], "amp"))
				{
					/* Ignored */
				}
				else if (!strcmp(w[j], "note"))
				{
					k = atoi(cp);
					if ((k < 0 || k > 127) || (*cp < '0' || *cp > '9'))
					{
						Printf("%s: line %d: note must be between 0 and 127\n", name, line);
						delete fp;
						return -2;
					}
					bank->tone[i].note = k;
				}
				else if (!strcmp(w[j], "pan"))
				{
					if (!strcmp(cp, "center"))
						k = 64;
					else if (!strcmp(cp, "left"))
						k = 0;
					else if (!strcmp(cp, "right"))
						k = 127;
					else
						k = ((atoi(cp)+100) * 100) / 157;
					if ((k < 0 || k > 127) ||
						(k == 0 && *cp != '-' && (*cp < '0' || *cp > '9')))
					{
						Printf("%s: line %d: panning must be left, right, "
							"center, or between -100 and 100\n", name, line);
						delete fp;
						return -2;
					}
					bank->tone[i].pan = k;
				}
				else if (!strcmp(w[j], "keep"))
				{
					if (!strcmp(cp, "env"))
						bank->tone[i].strip_envelope = 0;
					else if (!strcmp(cp, "loop"))
						bank->tone[i].strip_loop = 0;
					else
					{
						Printf("%s: line %d: keep must be env or loop\n", name, line);
						delete fp;
						return -2;
					}
				}
				else if (!strcmp(w[j], "strip"))
				{
					if (!strcmp(cp, "env"))
						bank->tone[i].strip_envelope = 1;
					else if (!strcmp(cp, "loop"))
						bank->tone[i].strip_loop = 1;
					else if (!strcmp(cp, "tail"))
						bank->tone[i].strip_tail = 1;
					else
					{
						Printf("%s: line %d: strip must be env, loop, or tail\n", name, line);
						delete fp;
						return -2;
					}
				}
				else
				{
					Printf("%s: line %d: bad patch option %s\n", name, line, w[j]);
					delete fp;
					return -2;
				}
			}
		}
	}
	/*
	if (ferror(fp))
	{
		Printf("Can't read %s: %s\n", name, strerror(errno));
		close_file(fp);
		return -2;
	}
	*/
	delete fp;
	return 0;
}